

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O0

void trico_decompress(uint32_t *number_of_floats,float **out,uint8_t *compressed)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32_t hash_size_exponent;
  uint32_t hash_size_exponent_00;
  uint uVar5;
  uint uVar6;
  uint32_t hash_mask;
  uint32_t hash_mask_00;
  float fVar7;
  void *ptr;
  void *ptr_00;
  float *pfVar8;
  byte *pbVar9;
  int local_e4;
  int j_3;
  int iStack_d8;
  uint8_t b_1;
  int j_2;
  int max_j;
  int j_1;
  uint uStack_c8;
  uint8_t b;
  int j;
  uint32_t q;
  uint32_t cnt;
  uint32_t *p_out;
  uint32_t last_value;
  uint32_t stride;
  uint32_t prediction2;
  uint32_t hash2;
  uint32_t prediction1;
  uint32_t hash1;
  uint32_t value;
  uint32_t xor [8];
  uint32_t bcode [8];
  uint32_t bc;
  uint32_t *hash_table_2;
  uint32_t *hash_table_1;
  uint32_t hash2_mask;
  uint32_t hash1_mask;
  uint32_t hash2_size;
  uint32_t hash1_size;
  uint32_t hash2_size_exponent;
  uint32_t hash1_size_exponent;
  uint8_t hash_info;
  uint8_t *compressed_local;
  float **out_local;
  uint32_t *number_of_floats_local;
  
  hash_size_exponent = ((int)(uint)*compressed >> 4) << 1;
  hash_size_exponent_00 = (*compressed & 0xf) << 1;
  uVar5 = 1 << (sbyte)hash_size_exponent;
  uVar6 = 1 << (sbyte)hash_size_exponent_00;
  hash_mask = uVar5 - 1;
  hash_mask_00 = uVar6 - 1;
  ptr = trico_calloc((ulong)uVar5,4);
  ptr_00 = trico_calloc((ulong)uVar6,4);
  *number_of_floats = (uint)compressed[1] << 0x18;
  *number_of_floats = (uint)compressed[2] << 0x10 | *number_of_floats;
  *number_of_floats = (uint)compressed[3] << 8 | *number_of_floats;
  _hash1_size_exponent = compressed + 5;
  *number_of_floats = (uint)compressed[4] | *number_of_floats;
  pfVar8 = (float *)trico_malloc((ulong)*number_of_floats << 2);
  *out = pfVar8;
  hash2 = 0;
  prediction2 = 0;
  stride = 0;
  last_value = 0;
  p_out._4_4_ = 0.0;
  _q = *out;
  uVar5 = *number_of_floats;
  for (uStack_c8 = 0; uStack_c8 < uVar5 >> 3; uStack_c8 = uStack_c8 + 1) {
    bVar1 = *_hash1_size_exponent;
    pbVar9 = _hash1_size_exponent + 2;
    bVar2 = _hash1_size_exponent[1];
    _hash1_size_exponent = _hash1_size_exponent + 3;
    bVar3 = *pbVar9;
    for (j_1 = 0; j_1 < 8; j_1 = j_1 + 1) {
      bVar4 = (byte)(((uint)bVar3 | (uint)bVar2 << 8 | (uint)bVar1 << 0x10) >>
                    ((char)j_1 * '\x03' & 0x1fU)) & 7;
      xor[(long)j_1 + 6] = (uint)bVar4;
      switch(bVar4) {
      case 0:
        (&hash1)[j_1] = 0;
        break;
      case 1:
        (&hash1)[j_1] = (uint)*_hash1_size_exponent;
        _hash1_size_exponent = _hash1_size_exponent + 1;
        break;
      case 2:
        (&hash1)[j_1] = (uint)*_hash1_size_exponent << 8;
        (&hash1)[j_1] = (uint)_hash1_size_exponent[1] | (&hash1)[j_1];
        _hash1_size_exponent = _hash1_size_exponent + 2;
        break;
      case 3:
        (&hash1)[j_1] = (uint)*_hash1_size_exponent << 0x10;
        (&hash1)[j_1] = (uint)_hash1_size_exponent[1] << 8 | (&hash1)[j_1];
        (&hash1)[j_1] = (uint)_hash1_size_exponent[2] | (&hash1)[j_1];
        _hash1_size_exponent = _hash1_size_exponent + 3;
        break;
      case 4:
        (&hash1)[j_1] = (uint)*_hash1_size_exponent << 0x18;
        (&hash1)[j_1] = (uint)_hash1_size_exponent[1] << 0x10 | (&hash1)[j_1];
        (&hash1)[j_1] = (uint)_hash1_size_exponent[2] << 8 | (&hash1)[j_1];
        (&hash1)[j_1] = (uint)_hash1_size_exponent[3] | (&hash1)[j_1];
        _hash1_size_exponent = _hash1_size_exponent + 4;
        break;
      case 5:
        (&hash1)[j_1] = (uint)*_hash1_size_exponent;
        _hash1_size_exponent = _hash1_size_exponent + 1;
        break;
      case 6:
        (&hash1)[j_1] = (uint)*_hash1_size_exponent << 8;
        (&hash1)[j_1] = (uint)_hash1_size_exponent[1] | (&hash1)[j_1];
        _hash1_size_exponent = _hash1_size_exponent + 2;
        break;
      case 7:
        (&hash1)[j_1] = (uint)*_hash1_size_exponent << 0x10;
        (&hash1)[j_1] = (uint)_hash1_size_exponent[1] << 8 | (&hash1)[j_1];
        (&hash1)[j_1] = (uint)_hash1_size_exponent[2] | (&hash1)[j_1];
        _hash1_size_exponent = _hash1_size_exponent + 3;
      }
    }
    for (j_2 = 0; j_2 < 8; j_2 = j_2 + 1) {
      if (4 < xor[(long)j_2 + 6]) {
        prediction2 = last_value;
      }
      fVar7 = (float)((&hash1)[j_2] ^ prediction2);
      *(float *)((long)ptr + (ulong)hash2 * 4) = fVar7;
      hash2 = trico_compute_hash1_32(hash2,(uint32_t)fVar7,hash_size_exponent,hash_mask);
      prediction2 = *(uint32_t *)((long)ptr + (ulong)hash2 * 4);
      *(int *)((long)ptr_00 + (ulong)stride * 4) = (int)fVar7 - (int)p_out._4_4_;
      stride = trico_compute_hash2_32
                         (stride,(int)fVar7 - (int)p_out._4_4_,hash_size_exponent_00,hash_mask_00);
      last_value = (int)fVar7 + *(int *)((long)ptr_00 + (ulong)stride * 4);
      *_q = fVar7;
      _q = _q + 1;
      p_out._4_4_ = fVar7;
    }
  }
  if ((*number_of_floats & 7) != 0) {
    bVar1 = *_hash1_size_exponent;
    pbVar9 = _hash1_size_exponent + 2;
    bVar2 = _hash1_size_exponent[1];
    _hash1_size_exponent = _hash1_size_exponent + 3;
    bVar3 = *pbVar9;
    iStack_d8 = 8;
    for (j_3 = 0; j_3 < iStack_d8; j_3 = j_3 + 1) {
      bVar4 = (byte)(((uint)bVar3 | (uint)bVar2 << 8 | (uint)bVar1 << 0x10) >>
                    ((char)j_3 * '\x03' & 0x1fU)) & 7;
      xor[(long)j_3 + 6] = (uint)bVar4;
      switch(bVar4) {
      case 0:
        (&hash1)[j_3] = 0;
        break;
      case 1:
        pbVar9 = _hash1_size_exponent + 1;
        (&hash1)[j_3] = (uint)*_hash1_size_exponent;
        _hash1_size_exponent = pbVar9;
        if ((&hash1)[j_3] == 0) {
          iStack_d8 = j_3;
        }
        break;
      case 2:
        (&hash1)[j_3] = (uint)*_hash1_size_exponent << 8;
        (&hash1)[j_3] = (uint)_hash1_size_exponent[1] | (&hash1)[j_3];
        _hash1_size_exponent = _hash1_size_exponent + 2;
        break;
      case 3:
        (&hash1)[j_3] = (uint)*_hash1_size_exponent << 0x10;
        (&hash1)[j_3] = (uint)_hash1_size_exponent[1] << 8 | (&hash1)[j_3];
        (&hash1)[j_3] = (uint)_hash1_size_exponent[2] | (&hash1)[j_3];
        _hash1_size_exponent = _hash1_size_exponent + 3;
        break;
      case 4:
        (&hash1)[j_3] = (uint)*_hash1_size_exponent << 0x18;
        (&hash1)[j_3] = (uint)_hash1_size_exponent[1] << 0x10 | (&hash1)[j_3];
        (&hash1)[j_3] = (uint)_hash1_size_exponent[2] << 8 | (&hash1)[j_3];
        (&hash1)[j_3] = (uint)_hash1_size_exponent[3] | (&hash1)[j_3];
        _hash1_size_exponent = _hash1_size_exponent + 4;
        break;
      case 5:
        (&hash1)[j_3] = (uint)*_hash1_size_exponent;
        _hash1_size_exponent = _hash1_size_exponent + 1;
        break;
      case 6:
        (&hash1)[j_3] = (uint)*_hash1_size_exponent << 8;
        (&hash1)[j_3] = (uint)_hash1_size_exponent[1] | (&hash1)[j_3];
        _hash1_size_exponent = _hash1_size_exponent + 2;
        break;
      case 7:
        (&hash1)[j_3] = (uint)*_hash1_size_exponent << 0x10;
        (&hash1)[j_3] = (uint)_hash1_size_exponent[1] << 8 | (&hash1)[j_3];
        (&hash1)[j_3] = (uint)_hash1_size_exponent[2] | (&hash1)[j_3];
        _hash1_size_exponent = _hash1_size_exponent + 3;
      }
    }
    for (local_e4 = 0; local_e4 < iStack_d8; local_e4 = local_e4 + 1) {
      if (4 < xor[(long)local_e4 + 6]) {
        prediction2 = last_value;
      }
      fVar7 = (float)((&hash1)[local_e4] ^ prediction2);
      *(float *)((long)ptr + (ulong)hash2 * 4) = fVar7;
      hash2 = trico_compute_hash1_32(hash2,(uint32_t)fVar7,hash_size_exponent,hash_mask);
      prediction2 = *(uint32_t *)((long)ptr + (ulong)hash2 * 4);
      *(int *)((long)ptr_00 + (ulong)stride * 4) = (int)fVar7 - (int)p_out._4_4_;
      stride = trico_compute_hash2_32
                         (stride,(int)fVar7 - (int)p_out._4_4_,hash_size_exponent_00,hash_mask_00);
      last_value = (int)fVar7 + *(int *)((long)ptr_00 + (ulong)stride * 4);
      *_q = fVar7;
      _q = _q + 1;
      p_out._4_4_ = fVar7;
    }
  }
  trico_free(ptr);
  trico_free(ptr_00);
  return;
}

Assistant:

void trico_decompress(uint32_t* number_of_floats, float** out, const uint8_t* compressed)
  {
  uint8_t hash_info = *compressed++;

  uint32_t hash1_size_exponent = (hash_info >> 4) << 1;
  uint32_t hash2_size_exponent = (hash_info & 15) << 1;

  const uint32_t hash1_size = 1 << hash1_size_exponent;
  const uint32_t hash2_size = 1 << hash2_size_exponent;
  const uint32_t hash1_mask = hash1_size - 1;
  const uint32_t hash2_mask = hash2_size - 1;

  uint32_t* hash_table_1 = (uint32_t*)trico_calloc(hash1_size, 4);
  uint32_t* hash_table_2 = (uint32_t*)trico_calloc(hash2_size, 4);

  *number_of_floats = ((uint32_t)(*compressed++)) << 24;
  *number_of_floats |= ((uint32_t)(*compressed++)) << 16;
  *number_of_floats |= ((uint32_t)(*compressed++)) << 8;
  *number_of_floats |= ((uint32_t)(*compressed++));
  *out = (float*)trico_malloc(*number_of_floats * sizeof(float));

  uint32_t bc;
  uint32_t bcode[8];
  uint32_t xor[8];
  uint32_t value;
  uint32_t hash1 = 0;
  uint32_t prediction1 = 0;
  uint32_t hash2 = 0;
  uint32_t prediction2 = 0;
  uint32_t stride;
  uint32_t last_value = 0;
  uint32_t* p_out = (uint32_t*)(*out);

  const uint32_t cnt = *number_of_floats / 8;
  for (uint32_t q = 0; q < cnt; ++q)
    {
    bc = ((uint32_t)(*compressed++)) << 16;
    bc |= ((uint32_t)(*compressed++)) << 8;
    bc |= (*compressed++);
    for (int j = 0; j < 8; ++j)
      {
      uint8_t b = (bc >> (j * 3)) & 7;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 2:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 24;
        xor[j] |= ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < 8; ++j)
      {
      if (bcode[j] > 4)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  if (*number_of_floats & 7)
    {
    bc = ((uint32_t)(*compressed++)) << 16;
    bc |= ((uint32_t)(*compressed++)) << 8;
    bc |= (*compressed++);
    int max_j = 8;
    for (int j = 0; j < max_j; ++j)
      {
      uint8_t b = (bc >> (j * 3)) & 7;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint32_t)(*compressed++));
        if (xor[j] == 0)
          max_j = j;
        break;
        }
        case 2:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 24;
        xor[j] |= ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < max_j; ++j)
      {
      if (bcode[j] > 4)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  trico_free(hash_table_1);
  trico_free(hash_table_2);
  }